

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O2

void summarize_cure(int tmd,effect_object_property **summaries,int *unsummarized_count)

{
  timed_failure *ptVar1;
  
  ptVar1 = (timed_failure *)&timed_effects[tmd].fail;
  while (ptVar1 = ptVar1->next, ptVar1 != (timed_failure *)0x0) {
    if (ptVar1->code == 2) {
      add_to_summaries(summaries,ptVar1->idx,0x51,200,EFPROP_CURE_RESIST);
    }
    else if (ptVar1->code == 1) {
      add_to_summaries(summaries,ptVar1->idx,0,0,EFPROP_CURE_FLAG);
    }
    else {
      *unsummarized_count = *unsummarized_count + 1;
    }
  }
  return;
}

Assistant:

static void summarize_cure(int tmd, struct effect_object_property **summaries,
		int *unsummarized_count)
{
	const struct timed_failure *f = timed_effects[tmd].fail;

	while (f) {
		if (f->code == TMD_FAIL_FLAG_OBJECT) {
			add_to_summaries(summaries, f->idx, 0, 0,
				EFPROP_CURE_FLAG);
		} else if (f->code == TMD_FAIL_FLAG_RESIST) {
			add_to_summaries(summaries, f->idx,
				RES_LEVEL_EFFECT + 1, RES_LEVEL_MIN,
				EFPROP_CURE_RESIST);
		} else {
			++*unsummarized_count;
		}
		f = f->next;
	}
}